

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  long lVar1;
  ImGuiContext *pIVar2;
  char *pcVar3;
  char *__dest;
  ulong uVar4;
  char *pcVar5;
  ImGuiSettingsHandler *pIVar6;
  void *pvVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  
  pIVar2 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xf03,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if ((GImGui->SettingsLoaded != false) || (GImGui->FrameCount != 0)) {
    __assert_fail("g.SettingsLoaded == false && g.FrameCount == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xf04,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (char *)(*GImAllocatorAllocFunc)(ini_size + 1,GImAllocatorUserData);
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  if (0 < (long)ini_size) {
    pcVar11 = __dest + ini_size;
    pvVar7 = (void *)0x0;
    pIVar6 = (ImGuiSettingsHandler *)0x0;
    pcVar10 = __dest;
    do {
      for (; (*pcVar10 == '\n' || (*pcVar10 == '\r')); pcVar10 = pcVar10 + 1) {
      }
      uVar4 = 0;
      pcVar12 = pcVar10;
      if (pcVar10 < pcVar11) {
        do {
          if ((pcVar10[uVar4] == '\n') || (pcVar10[uVar4] == '\r')) break;
          lVar8 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while (pcVar10 + lVar8 < pcVar11);
        pcVar12 = pcVar10 + uVar4;
      }
      *pcVar12 = '\0';
      if (((uVar4 == 0) || (*pcVar10 != '[')) || (pcVar10[uVar4 - 1] != ']')) {
        if ((pIVar6 != (ImGuiSettingsHandler *)0x0) && (pvVar7 != (void *)0x0)) {
          (*pIVar6->ReadLineFn)(pIVar2,pIVar6,pvVar7,pcVar10);
        }
      }
      else {
        pcVar10[uVar4 - 1] = '\0';
        if (2 < uVar4) {
          lVar8 = 1;
          do {
            if (pcVar10[lVar8] == ']') {
              pcVar9 = pcVar10 + lVar8;
              goto LAB_001813c0;
            }
            lVar1 = lVar8 - uVar4;
            lVar8 = lVar8 + 1;
          } while (lVar1 != -2);
        }
        pcVar9 = (char *)0x0;
LAB_001813c0:
        if (pcVar9 == (char *)0x0) {
LAB_001813e7:
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = (char *)0x0;
          pcVar3 = pcVar9 + 1;
          if (pcVar9 + 1 < pcVar10 + (uVar4 - 1)) {
            do {
              pcVar5 = pcVar3;
              if (*pcVar5 == '[') goto LAB_001813ee;
              pcVar3 = pcVar5 + 1;
            } while (pcVar5 + 1 != pcVar10 + (uVar4 - 1));
            goto LAB_001813e7;
          }
        }
LAB_001813ee:
        pcVar10 = pcVar10 + 1;
        if (pcVar5 == (char *)0x0 || pcVar9 == (char *)0x0) {
          pcVar9 = "Window";
        }
        else {
          *pcVar9 = '\0';
          pcVar9 = pcVar10;
          pcVar10 = pcVar5 + 1;
        }
        pIVar6 = FindSettingsHandler(pcVar9);
        if (pIVar6 == (ImGuiSettingsHandler *)0x0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = (*pIVar6->ReadOpenFn)(pIVar2,pIVar6,pcVar10);
        }
      }
      pcVar10 = pcVar12 + 1;
    } while (pcVar10 < pcVar11);
  }
  if (__dest != (char *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
  }
  (*GImAllocatorFreeFunc)(__dest,GImAllocatorUserData);
  pIVar2->SettingsLoaded = true;
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)ImGui::MemAlloc(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;

        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(intptr_t)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
            {
                name_start = type_start; // Import legacy entries that have no type
                type_start = "Window";
            }
            else
            {
                *type_end = 0; // Overwrite first ']'
                name_start++;  // Skip second '['
            }
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    ImGui::MemFree(buf);
    g.SettingsLoaded = true;
}